

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall
MutableS2ShapeIndex::AbsorbIndexCell
          (MutableS2ShapeIndex *this,S2PaddedCell *pcell,Iterator *iter,
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          *edges,InteriorTracker *tracker,EdgeAllocator *alloc)

{
  pointer *this_00;
  FaceEdge *pFVar1;
  R2Rect *pRVar2;
  R2Rect *pRVar3;
  EdgeAllocator *pEVar4;
  InteriorTracker *this_01;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  reference ppCVar9;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_> *this_02;
  S2ShapeIndexCell *this_03;
  S2ClippedShape *this_04;
  S2Shape *this_05;
  ostream *poVar10;
  R2Rect *clip;
  ulong uVar11;
  size_type sVar12;
  reference ppCVar13;
  S2CellId local_2b8;
  ClippedEdge **local_2b0;
  ClippedEdge **local_2a8;
  __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_**,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
  local_2a0;
  __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_**,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
  local_298;
  __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_**,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
  local_290;
  const_iterator local_288;
  value_type local_280;
  ClippedEdge *clipped_2;
  undefined1 auStack_270 [4];
  int i_1;
  VType VStack_268;
  VType local_260;
  VType VStack_258;
  ClippedEdge *local_250;
  ClippedEdge *clipped_1;
  FaceEdge *face_edge_1;
  iterator __end1;
  iterator __begin1;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_> *__range1;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  new_edges;
  S2CellId local_200;
  undefined1 local_1f8 [48];
  uint local_1c8;
  int local_1c4;
  int e;
  int i;
  S2Point local_1b8;
  S2Point local_1a0;
  undefined1 local_188 [8];
  FaceEdge edge_1;
  int num_edges;
  S2Shape *shape;
  int shape_id;
  S2ClippedShape *clipped;
  int s;
  S2ShapeIndexCell *cell;
  bool tracker_moved;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_> *face_edges;
  FaceEdge *face_edge;
  ClippedEdge *edge;
  iterator __end2;
  iterator __begin2;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *__range2;
  uint64 local_b8;
  S2Point local_b0;
  S2Point local_98;
  uint64 local_7c;
  byte local_61;
  S2LogMessage local_60;
  S2LogMessageVoidify local_49;
  uint64 local_48;
  S2CellId local_40;
  EdgeAllocator *local_38;
  EdgeAllocator *alloc_local;
  InteriorTracker *tracker_local;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *edges_local;
  Iterator *iter_local;
  S2PaddedCell *pcell_local;
  MutableS2ShapeIndex *this_local;
  
  local_38 = alloc;
  alloc_local = (EdgeAllocator *)tracker;
  tracker_local = (InteriorTracker *)edges;
  edges_local = (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 *)iter;
  iter_local = (Iterator *)pcell;
  pcell_local = (S2PaddedCell *)this;
  local_40 = S2PaddedCell::id(pcell);
  local_48 = (uint64)S2ShapeIndex::IteratorBase::id((IteratorBase *)edges_local);
  bVar5 = ::operator==(local_40,(S2CellId)local_48);
  local_61 = 0;
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
               ,0x4e7,kFatal,(ostream *)&std::cerr);
    local_61 = 1;
    poVar10 = S2LogMessage::stream(&local_60);
    poVar10 = std::operator<<(poVar10,"Check failed: (pcell.id()) == (iter.id()) ");
    S2LogMessageVoidify::operator&(&local_49,poVar10);
  }
  if ((local_61 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
  }
  bVar5 = InteriorTracker::is_active((InteriorTracker *)alloc_local);
  if ((bVar5) &&
     (bVar5 = std::
              vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              ::empty((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                       *)tracker_local), !bVar5)) {
    ppCVar13 = std::
               vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               ::operator[]((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                             *)tracker_local,0);
    bVar5 = is_shape_being_removed(this,(*ppCVar13)->face_edge->shape_id);
    pEVar4 = alloc_local;
    if (bVar5) {
      local_7c = (uint64)S2PaddedCell::id((S2PaddedCell *)iter_local);
      bVar5 = InteriorTracker::at_cellid((InteriorTracker *)pEVar4,(S2CellId)local_7c);
      pEVar4 = alloc_local;
      if (((bVar5 ^ 0xffU) & 1) != 0) {
        S2PaddedCell::GetEntryVertex(&local_98,(S2PaddedCell *)iter_local);
        InteriorTracker::MoveTo((InteriorTracker *)pEVar4,&local_98);
      }
      pEVar4 = alloc_local;
      S2PaddedCell::GetExitVertex(&local_b0,(S2PaddedCell *)iter_local);
      InteriorTracker::DrawTo((InteriorTracker *)pEVar4,&local_b0);
      pEVar4 = alloc_local;
      __range2 = (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                  *)S2PaddedCell::id((S2PaddedCell *)iter_local);
      local_b8 = (uint64)S2CellId::next((S2CellId *)&__range2);
      InteriorTracker::set_next_cellid((InteriorTracker *)pEVar4,(S2CellId)local_b8);
      this_01 = tracker_local;
      __end2 = std::
               vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               ::begin((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                        *)tracker_local);
      edge = (ClippedEdge *)
             std::
             vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             ::end((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    *)this_01);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_**,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
                                         *)&edge), bVar5) {
        ppCVar9 = __gnu_cxx::
                  __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_**,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
                  ::operator*(&__end2);
        pFVar1 = (*ppCVar9)->face_edge;
        bVar5 = is_shape_being_removed(this,pFVar1->shape_id);
        if (!bVar5) break;
        if ((pFVar1->has_interior & 1U) != 0) {
          InteriorTracker::TestEdge((InteriorTracker *)alloc_local,pFVar1->shape_id,&pFVar1->edge);
        }
        __gnu_cxx::
        __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_**,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
        ::operator++(&__end2);
      }
    }
  }
  InteriorTracker::SaveAndClearStateBefore
            ((InteriorTracker *)alloc_local,this->pending_additions_begin_);
  this_02 = EdgeAllocator::mutable_face_edges(local_38);
  std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::clear
            (this_02);
  bVar5 = false;
  this_03 = Iterator::cell((Iterator *)edges_local);
  for (clipped._4_4_ = 0; iVar7 = S2ShapeIndexCell::num_clipped(this_03), clipped._4_4_ < iVar7;
      clipped._4_4_ = clipped._4_4_ + 1) {
    this_04 = S2ShapeIndexCell::clipped(this_03,clipped._4_4_);
    iVar7 = S2ClippedShape::shape_id(this_04);
    this_05 = MutableS2ShapeIndex::shape(this,iVar7);
    if (this_05 != (S2Shape *)0x0) {
      edge_1.edge.v1.c_[2]._4_4_ = S2ClippedShape::num_edges(this_04);
      FaceEdge::FaceEdge((FaceEdge *)local_188);
      local_188._0_4_ = S2Shape::id(this_05);
      iVar8 = (*this_05->_vptr_S2Shape[4])();
      pEVar4 = alloc_local;
      edge_1.edge_id._0_1_ = iVar8 == 2;
      if ((bool)(byte)edge_1.edge_id) {
        bVar6 = S2ClippedShape::contains_center(this_04);
        InteriorTracker::AddShape((InteriorTracker *)pEVar4,iVar7,bVar6);
        pEVar4 = alloc_local;
        if ((!bVar5) && (0 < edge_1.edge.v1.c_[2]._4_4_)) {
          S2PaddedCell::GetCenter(&local_1a0,(S2PaddedCell *)iter_local);
          InteriorTracker::MoveTo((InteriorTracker *)pEVar4,&local_1a0);
          pEVar4 = alloc_local;
          S2PaddedCell::GetEntryVertex(&local_1b8,(S2PaddedCell *)iter_local);
          InteriorTracker::DrawTo((InteriorTracker *)pEVar4,&local_1b8);
          pEVar4 = alloc_local;
          _e = S2PaddedCell::id((S2PaddedCell *)iter_local);
          InteriorTracker::set_next_cellid((InteriorTracker *)pEVar4,_e);
          bVar5 = true;
        }
      }
      for (local_1c4 = 0; local_1c4 < edge_1.edge.v1.c_[2]._4_4_; local_1c4 = local_1c4 + 1) {
        local_1c8 = S2ClippedShape::edge(this_04,local_1c4);
        local_188._4_4_ = local_1c8;
        (*this_05->_vptr_S2Shape[3])(local_1f8,this_05,(ulong)local_1c8);
        memcpy(edge_1.b.c_ + 1,local_1f8,0x30);
        edge_1.shape_id = GetEdgeMaxLevel(this,(Edge *)(edge_1.b.c_ + 1));
        if (((byte)edge_1.edge_id & 1) != 0) {
          InteriorTracker::TestEdge((InteriorTracker *)alloc_local,iVar7,(Edge *)(edge_1.b.c_ + 1));
        }
        local_200 = S2PaddedCell::id((S2PaddedCell *)iter_local);
        iVar8 = S2CellId::face(&local_200);
        bVar6 = S2::ClipToPaddedFace
                          ((S2Point *)(edge_1.b.c_ + 1),(S2Point *)(edge_1.edge.v0.c_ + 2),iVar8,
                           kCellPadding,(R2Point *)&edge_1.max_level,(R2Point *)(edge_1.a.c_ + 1));
        if (((bVar6 ^ 0xffU) & 1) != 0) {
          this_00 = &new_edges.
                     super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)this_00,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
                     ,0x536,kFatal,(ostream *)&std::cerr);
          poVar10 = S2LogMessage::stream((S2LogMessage *)this_00);
          std::operator<<(poVar10,"Invariant failure in MutableS2ShapeIndex");
          S2FatalLogMessage::~S2FatalLogMessage
                    ((S2FatalLogMessage *)
                     &new_edges.
                      super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
        push_back(this_02,(value_type *)local_188);
      }
    }
  }
  std::
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ::vector((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            *)&__range1);
  __end1 = std::
           vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
           begin(this_02);
  face_edge_1 = (FaceEdge *)
                std::
                vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                ::end(this_02);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<MutableS2ShapeIndex::FaceEdge_*,_std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>_>
                                     *)&face_edge_1), bVar5) {
    clipped_1 = (ClippedEdge *)
                __gnu_cxx::
                __normal_iterator<MutableS2ShapeIndex::FaceEdge_*,_std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>_>
                ::operator*(&__end1);
    local_250 = EdgeAllocator::NewClippedEdge(local_38);
    local_250->face_edge = (FaceEdge *)clipped_1;
    pRVar2 = &clipped_1->bound;
    pRVar3 = &clipped_1->bound;
    clip = S2PaddedCell::bound((S2PaddedCell *)iter_local);
    S2::GetClippedEdgeBound
              ((R2Rect *)auStack_270,(R2Point *)(pRVar2->bounds_[0].bounds_.c_ + 1),
               (R2Point *)(pRVar3->bounds_[1].bounds_.c_ + 1),clip);
    (local_250->bound).bounds_[1].bounds_.c_[0] = local_260;
    (local_250->bound).bounds_[1].bounds_.c_[1] = VStack_258;
    (local_250->bound).bounds_[0].bounds_.c_[0] = _auStack_270;
    (local_250->bound).bounds_[0].bounds_.c_[1] = VStack_268;
    std::
    vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ::push_back((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 *)&__range1,&local_250);
    __gnu_cxx::
    __normal_iterator<MutableS2ShapeIndex::FaceEdge_*,_std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>_>
    ::operator++(&__end1);
  }
  clipped_2._4_4_ = 0;
  do {
    uVar11 = (ulong)clipped_2._4_4_;
    sVar12 = std::
             vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             ::size((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                     *)tracker_local);
    if (sVar12 <= uVar11) {
LAB_0038ac08:
      std::
      vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ::swap((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              *)tracker_local,
             (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              *)&__range1);
      local_2b8 = S2PaddedCell::id((S2PaddedCell *)iter_local);
      gtl::internal_btree::
      btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
      ::erase<S2CellId>((btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                         *)&this->cell_map_,&local_2b8);
      if (this_03 != (S2ShapeIndexCell *)0x0) {
        S2ShapeIndexCell::~S2ShapeIndexCell(this_03);
        operator_delete(this_03);
      }
      std::
      vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ::~vector((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 *)&__range1);
      return;
    }
    ppCVar13 = std::
               vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               ::operator[]((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                             *)tracker_local,(long)clipped_2._4_4_);
    local_280 = *ppCVar13;
    bVar5 = is_shape_being_removed(this,local_280->face_edge->shape_id);
    if (!bVar5) {
      local_290._M_current =
           (ClippedEdge **)
           std::
           vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
           ::end((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                  *)&__range1);
      __gnu_cxx::
      __normal_iterator<MutableS2ShapeIndex::ClippedEdge_const*const*,std::vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>>
      ::__normal_iterator<MutableS2ShapeIndex::ClippedEdge_const**>
                ((__normal_iterator<MutableS2ShapeIndex::ClippedEdge_const*const*,std::vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>>
                  *)&local_288,&local_290);
      local_2a0._M_current =
           (ClippedEdge **)
           std::
           vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
           ::begin((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    *)tracker_local);
      local_298 = __gnu_cxx::
                  __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_**,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
                  ::operator+(&local_2a0,(long)clipped_2._4_4_);
      local_2a8 = (ClippedEdge **)
                  std::
                  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                  ::end((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                         *)tracker_local);
      local_2b0 = (ClippedEdge **)
                  std::
                  vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                  ::
                  insert<__gnu_cxx::__normal_iterator<MutableS2ShapeIndex::ClippedEdge_const**,std::vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>>,void>
                            ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                              *)&__range1,local_288,local_298,
                             (__normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_**,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
                              )local_2a8);
      goto LAB_0038ac08;
    }
    clipped_2._4_4_ = clipped_2._4_4_ + 1;
  } while( true );
}

Assistant:

void MutableS2ShapeIndex::AbsorbIndexCell(const S2PaddedCell& pcell,
                                          const Iterator& iter,
                                          vector<const ClippedEdge*>* edges,
                                          InteriorTracker* tracker,
                                          EdgeAllocator* alloc) {
  S2_DCHECK_EQ(pcell.id(), iter.id());

  // When we absorb a cell, we erase all the edges that are being removed.
  // However when we are finished with this cell, we want to restore the state
  // of those edges (since that is how we find all the index cells that need
  // to be updated).  The edges themselves are restored automatically when
  // UpdateEdges returns from its recursive call, but the InteriorTracker
  // state needs to be restored explicitly.
  //
  // Here we first update the InteriorTracker state for removed edges to
  // correspond to the exit vertex of this cell, and then save the
  // InteriorTracker state.  This state will be restored by UpdateEdges when
  // it is finished processing the contents of this cell.
  if (tracker->is_active() && !edges->empty() &&
      is_shape_being_removed((*edges)[0]->face_edge->shape_id)) {
    // We probably need to update the InteriorTracker.  ("Probably" because
    // it's possible that all shapes being removed do not have interiors.)
    if (!tracker->at_cellid(pcell.id())) {
      tracker->MoveTo(pcell.GetEntryVertex());
    }
    tracker->DrawTo(pcell.GetExitVertex());
    tracker->set_next_cellid(pcell.id().next());
    for (const ClippedEdge* edge : *edges) {
      const FaceEdge* face_edge = edge->face_edge;
      if (!is_shape_being_removed(face_edge->shape_id)) {
        break;  // All shapes being removed come first.
      }
      if (face_edge->has_interior) {
        tracker->TestEdge(face_edge->shape_id, face_edge->edge);
      }
    }
  }
  // Save the state of the edges being removed, so that it can be restored
  // when we are finished processing this cell and its children.  We don't
  // need to save the state of the edges being added because they aren't being
  // removed from "edges" and will therefore be updated normally as we visit
  // this cell and its children.
  tracker->SaveAndClearStateBefore(pending_additions_begin_);

  // Create a FaceEdge for each edge in this cell that isn't being removed.
  vector<FaceEdge>* face_edges = alloc->mutable_face_edges();
  face_edges->clear();
  bool tracker_moved = false;
  const S2ShapeIndexCell& cell = iter.cell();
  for (int s = 0; s < cell.num_clipped(); ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    int shape_id = clipped.shape_id();
    const S2Shape* shape = this->shape(shape_id);
    if (shape == nullptr) continue;  // This shape is being removed.
    int num_edges = clipped.num_edges();

    // If this shape has an interior, start tracking whether we are inside the
    // shape.  UpdateEdges() wants to know whether the entry vertex of this
    // cell is inside the shape, but we only know whether the center of the
    // cell is inside the shape, so we need to test all the edges against the
    // line segment from the cell center to the entry vertex.
    FaceEdge edge;
    edge.shape_id = shape->id();
    edge.has_interior = (shape->dimension() == 2);
    if (edge.has_interior) {
      tracker->AddShape(shape_id, clipped.contains_center());
      // There might not be any edges in this entire cell (i.e., it might be
      // in the interior of all shapes), so we delay updating the tracker
      // until we see the first edge.
      if (!tracker_moved && num_edges > 0) {
        tracker->MoveTo(pcell.GetCenter());
        tracker->DrawTo(pcell.GetEntryVertex());
        tracker->set_next_cellid(pcell.id());
        tracker_moved = true;
      }
    }
    for (int i = 0; i < num_edges; ++i) {
      int e = clipped.edge(i);
      edge.edge_id = e;
      edge.edge = shape->edge(e);
      edge.max_level = GetEdgeMaxLevel(edge.edge);
      if (edge.has_interior) tracker->TestEdge(shape_id, edge.edge);
      if (!S2::ClipToPaddedFace(edge.edge.v0, edge.edge.v1, pcell.id().face(),
                                kCellPadding, &edge.a, &edge.b)) {
        S2_LOG(DFATAL) << "Invariant failure in MutableS2ShapeIndex";
      }
      face_edges->push_back(edge);
    }
  }
  // Now create a ClippedEdge for each FaceEdge, and put them in "new_edges".
  vector<const ClippedEdge*> new_edges;
  for (const FaceEdge& face_edge : *face_edges) {
    ClippedEdge* clipped = alloc->NewClippedEdge();
    clipped->face_edge = &face_edge;
    clipped->bound = S2::GetClippedEdgeBound(face_edge.a, face_edge.b,
                                                     pcell.bound());
    new_edges.push_back(clipped);
  }
  // Discard any edges from "edges" that are being removed, and append the
  // remainder to "new_edges".  (This keeps the edges sorted by shape id.)
  for (int i = 0; i < edges->size(); ++i) {
    const ClippedEdge* clipped = (*edges)[i];
    if (!is_shape_being_removed(clipped->face_edge->shape_id)) {
      new_edges.insert(new_edges.end(), edges->begin() + i, edges->end());
      break;
    }
  }
  // Update the edge list and delete this cell from the index.
  edges->swap(new_edges);
  cell_map_.erase(pcell.id());
  delete &cell;
}